

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minAbs(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  type_conflict5 tVar1;
  cpp_dec_float<100U,_int,_void> *in_RSI;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *mini;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffe38;
  cpp_dec_float<100U,_int,_void> *val;
  undefined1 local_1a4 [80];
  undefined1 local_154 [80];
  undefined1 local_104 [160];
  int local_64;
  undefined8 local_50;
  undefined8 local_48;
  long local_38;
  undefined1 *local_30;
  long local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 local_8;
  
  val = in_RDI;
  local_48 = infinity();
  local_50 = 0;
  local_8 = local_48;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_RSI,(double)val,in_RDI);
  local_64 = size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_RSI);
  while (local_64 = local_64 + -1, -1 < local_64) {
    local_38 = *(long *)(in_RSI->data)._M_elems + (long)local_64 * 0x54;
    local_30 = local_104;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_RDI,in_stack_fffffffffffffe38);
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_fffffffffffffe38);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffe38,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x4fef71);
    if (tVar1) {
      local_28 = *(long *)(in_RSI->data)._M_elems + (long)local_64 * 0x54;
      local_20 = local_1a4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_RDI,in_stack_fffffffffffffe38);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffe38);
      local_18 = local_154;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_RDI,in_stack_fffffffffffffe38);
    }
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

R minAbs() const
   {
      R mini = R(infinity);

      for(int i = size() - 1; i >= 0; --i)
      {
         if(spxAbs(m_elem[i].val) < mini)
            mini = spxAbs(m_elem[i].val);
      }

      assert(mini >= 0);

      return mini;
   }